

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  int iVar1;
  Table *pTVar2;
  GCObject *pGVar3;
  Table **ppTVar4;
  GCObject *pGVar5;
  
  iVar1 = o->tt;
  if (((long)iVar1 == 7) || (iVar1 == 5)) {
    ppTVar4 = &(((o->value).gc)->h).metatable;
  }
  else {
    ppTVar4 = L->l_G->mt + iVar1;
  }
  pTVar2 = *ppTVar4;
  if (pTVar2 != (Table *)0x0) {
    pGVar3 = (GCObject *)L->l_G->tmname[event];
    pGVar5 = (GCObject *)
             (pTVar2->node +
             (int)(~(uint)(-1L << (pTVar2->lsizenode & 0x3f)) & *(uint *)((long)pGVar3 + 0xc)));
    do {
      if ((*(int *)&(&pGVar5->gch)[1].tt == 4) && (((Value *)&(&pGVar5->gch)[1].next)->gc == pGVar3)
         ) {
        return (TValue *)pGVar5;
      }
      pGVar5 = ((Value *)&(&pGVar5->gch)[2].next)->gc;
    } while (pGVar5 != (GCObject *)0x0);
  }
  return &luaO_nilobject_;
}

Assistant:

static const TValue*luaT_gettmbyobj(lua_State*L,const TValue*o,TMS event){
Table*mt;
switch(ttype(o)){
case 5:
mt=hvalue(o)->metatable;
break;
case 7:
mt=uvalue(o)->metatable;
break;
default:
mt=G(L)->mt[ttype(o)];
}
return(mt?luaH_getstr(mt,G(L)->tmname[event]):(&luaO_nilobject_));
}